

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int set_snode_insert_node(lyxp_set *set,lys_node *node,lyxp_node_type node_type)

{
  uint uVar1;
  uint32_t uVar2;
  ulong uVar3;
  lyxp_set_nodes *plVar4;
  LY_ERR *pLVar5;
  lyxp_node_type *plVar6;
  ulong uVar7;
  
  if (set->type != LYXP_SET_SNODE_SET) {
    __assert_fail("set->type == LYXP_SET_SNODE_SET",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                  ,0x3ac,
                  "int set_snode_insert_node(struct lyxp_set *, const struct lys_node *, enum lyxp_node_type)"
                 );
  }
  uVar1 = set->used;
  uVar3 = 0xffffffff;
  if ((ulong)uVar1 != 0) {
    plVar6 = &((set->val).nodes)->type;
    uVar7 = 0;
    do {
      if (((lys_node *)((lyxp_set_nodes *)(plVar6 + -2))->node == node) && (*plVar6 == node_type)) {
        uVar3 = uVar7 & 0xffffffff;
        break;
      }
      uVar7 = uVar7 + 1;
      plVar6 = plVar6 + 4;
    } while (uVar1 != uVar7);
  }
  uVar2 = (uint32_t)uVar3;
  if ((int)uVar2 < 0) {
    if (uVar1 == set->size) {
      plVar4 = (lyxp_set_nodes *)ly_realloc((set->val).nodes,(ulong)(set->size + 2) << 4);
      (set->val).nodes = plVar4;
      if (plVar4 == (lyxp_set_nodes *)0x0) {
        pLVar5 = ly_errno_location();
        *pLVar5 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","set_snode_insert_node");
        return -1;
      }
      set->size = set->size + 2;
    }
    uVar2 = set->used;
    (set->val).nodes[(int)uVar2].node = (lyd_node *)node;
    (set->val).nodes[(int)uVar2].type = node_type;
    (set->val).nodes[(int)uVar2].pos = 1;
    set->used = uVar2 + 1;
  }
  else {
    (set->val).nodes[uVar3].pos = 1;
  }
  return uVar2;
}

Assistant:

static int
set_snode_insert_node(struct lyxp_set *set, const struct lys_node *node, enum lyxp_node_type node_type)
{
    int ret;

    assert(set->type == LYXP_SET_SNODE_SET);

    ret = set_snode_dup_node_check(set, node, node_type, -1);
    if (ret > -1) {
        set->val.snodes[ret].in_ctx = 1;
    } else {
        if (set->used == set->size) {
            set->val.snodes = ly_realloc(set->val.snodes, (set->size + LYXP_SET_SIZE_STEP) * sizeof *set->val.snodes);
            if (!set->val.snodes) {
                LOGMEM;
                return -1;
            }
            set->size += LYXP_SET_SIZE_STEP;
        }

        ret = set->used;
        set->val.snodes[ret].snode = (struct lys_node *)node;
        set->val.snodes[ret].type = node_type;
        set->val.snodes[ret].in_ctx = 1;
        ++set->used;
    }

    return ret;
}